

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

LimitToken __thiscall
google::protobuf::internal::EpsCopyInputStream::PushLimit
          (EpsCopyInputStream *this,char *ptr,int limit)

{
  int iVar1;
  long lVar2;
  LogMessage *pLVar3;
  int *piVar4;
  uint in_ECX;
  undefined4 in_register_00000014;
  bool local_45;
  int local_40;
  int old_limit;
  LogMessage local_38;
  Voidify local_25;
  uint local_24;
  undefined8 uStack_20;
  int limit_local;
  char *ptr_local;
  EpsCopyInputStream *this_local;
  
  uStack_20 = CONCAT44(in_register_00000014,limit);
  old_limit._3_1_ = 0;
  local_45 = 0x7fffffef < in_ECX;
  local_24 = in_ECX;
  ptr_local = ptr;
  this_local = this;
  if (local_45) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
               ,0x9e,"limit >= 0 && limit <= INT_MAX - kSlopBytes");
    old_limit._3_1_ = 1;
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_25,pLVar3);
  }
  if ((old_limit._3_1_ & 1) == 0) {
    local_24 = ((int)uStack_20 - (int)*(undefined8 *)(ptr + 8)) + local_24;
    lVar2 = *(long *)(ptr + 8);
    local_40 = 0;
    piVar4 = std::min<int>(&local_40,(int *)&local_24);
    *(long *)ptr = lVar2 + *piVar4;
    iVar1 = *(int *)(ptr + 0x1c);
    *(uint *)(ptr + 0x1c) = local_24;
    LimitToken::LimitToken((LimitToken *)this,iVar1 - local_24);
    return (LimitToken)(int)this;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_38);
}

Assistant:

[[nodiscard]] LimitToken PushLimit(const char* ptr, int limit) {
    ABSL_DCHECK(limit >= 0 && limit <= INT_MAX - kSlopBytes);
    // This add is safe due to the invariant above, because
    // ptr - buffer_end_ <= kSlopBytes.
    limit += static_cast<int>(ptr - buffer_end_);
    limit_end_ = buffer_end_ + (std::min)(0, limit);
    auto old_limit = limit_;
    limit_ = limit;
    return LimitToken(old_limit - limit);
  }